

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_dma_heap.c
# Opt level: O1

MPP_RET try_flip_flag(RK_U32 orig,RK_U32 flag)

{
  uint uVar1;
  RK_S32 RVar2;
  ulong uVar3;
  
  uVar1 = flag | orig;
  if ((flag & orig) != 0) {
    uVar1 = ~flag & orig;
  }
  uVar3 = (ulong)uVar1;
  if (0 < heap_infos[uVar3].fd) {
    RVar2 = fcntl64(heap_infos[uVar3].fd,0x406,3);
    heap_infos[orig].fd = RVar2;
    heap_infos[orig].flags = heap_infos[uVar3].flags;
    if (((byte)dma_heap_debug & 8) != 0) {
      _mpp_log_l(4,"mpp_dma_heap","dma-heap type %x %s remap to %x %s\n",(char *)0x0,orig,
                 heap_infos[orig].name,uVar3,heap_infos[uVar3].name);
    }
  }
  return -(uint)(heap_infos[orig].fd < 1);
}

Assistant:

static MPP_RET try_flip_flag(RK_U32 orig, RK_U32 flag)
{
    DmaHeapInfo *dst = &heap_infos[orig];
    DmaHeapInfo *src;
    RK_U32 used;

    if (orig & flag)
        used = (RK_U32)(orig & (~flag));
    else
        used = (RK_U32)(orig | flag);

    src = &heap_infos[used];
    if (src->fd > 0) {
        /* found valid heap use it */
        dst->fd = mpp_dup(src->fd);
        dst->flags = src->flags;

        dma_heap_dbg_chk("dma-heap type %x %s remap to %x %s\n",
                         orig, dst->name, used, src->name);
    }

    return dst->fd > 0 ? MPP_OK : MPP_NOK;
}